

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O2

_Bool effect_damages(effect *effect)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  effect *effect_00;
  int i;
  int iVar4;
  bool bVar5;
  
  if ((effect->index == 0x6a) || (effect->index == 1)) {
    effect_00 = effect->next;
    iVar2 = dice_evaluate(effect->dice,0,AVERAGE,(random_value *)0x0);
    for (iVar4 = 0; bVar5 = iVar4 < iVar2 && effect_00 != (effect *)0x0,
        iVar4 < iVar2 && effect_00 != (effect *)0x0; iVar4 = iVar4 + 1) {
      _Var1 = effect_damages(effect_00);
      if (_Var1) {
        return bVar5;
      }
      effect_00 = effect_00->next;
    }
  }
  else {
    pcVar3 = effect_info(effect);
    if (pcVar3 == (char *)0x0) {
      bVar5 = false;
    }
    else {
      pcVar3 = effect_info(effect);
      iVar2 = strcmp(pcVar3,"dam");
      bVar5 = iVar2 == 0;
    }
  }
  return bVar5;
}

Assistant:

bool effect_damages(const struct effect *effect)
{
	if (effect->index == EF_RANDOM || effect->index == EF_SELECT) {
		// Random or select effect
		struct effect *e = effect->next;
		int num_subeffects = dice_evaluate(effect->dice, 0, AVERAGE, NULL);

		// Check if any of the subeffects do damage
		for (int i = 0; e != NULL && i < num_subeffects; i++) {
			if (effect_damages(e)) {
				return true;
			}
			e = e->next;
		}
		return false;
	} else {
		// Not a random or select effect, check the info string for
		// damage
		return effect_info(effect) != NULL &&
			streq(effect_info(effect), "dam");
	}
}